

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O2

void col_txfm_4x8_rounding(__m128i *in,int shift)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  longlong lVar17;
  longlong lVar18;
  longlong lVar19;
  longlong lVar20;
  longlong lVar21;
  longlong lVar22;
  longlong lVar23;
  longlong lVar24;
  longlong lVar25;
  longlong lVar26;
  longlong lVar27;
  longlong lVar28;
  longlong lVar29;
  longlong lVar30;
  longlong lVar31;
  int iVar32;
  undefined1 auVar33 [16];
  
  iVar32 = 1 << ((char)shift - 1U & 0x1f);
  iVar1 = *(int *)((long)*in + 4);
  lVar17 = (*in)[1];
  iVar2 = *(int *)((long)*in + 0xc);
  lVar18 = in[1][0];
  iVar3 = *(int *)((long)in[1] + 4);
  lVar19 = in[1][1];
  iVar4 = *(int *)((long)in[1] + 0xc);
  lVar20 = in[2][0];
  iVar5 = *(int *)((long)in[2] + 4);
  lVar21 = in[2][1];
  iVar6 = *(int *)((long)in[2] + 0xc);
  lVar22 = in[3][0];
  iVar7 = *(int *)((long)in[3] + 4);
  lVar23 = in[3][1];
  iVar8 = *(int *)((long)in[3] + 0xc);
  lVar24 = in[4][0];
  iVar9 = *(int *)((long)in[4] + 4);
  lVar25 = in[4][1];
  iVar10 = *(int *)((long)in[4] + 0xc);
  lVar26 = in[5][0];
  iVar11 = *(int *)((long)in[5] + 4);
  lVar27 = in[5][1];
  iVar12 = *(int *)((long)in[5] + 0xc);
  lVar28 = in[6][0];
  iVar13 = *(int *)((long)in[6] + 4);
  lVar29 = in[6][1];
  iVar14 = *(int *)((long)in[6] + 0xc);
  lVar30 = in[7][0];
  iVar15 = *(int *)((long)in[7] + 4);
  lVar31 = in[7][1];
  iVar16 = *(int *)((long)in[7] + 0xc);
  auVar33 = ZEXT416((uint)shift);
  *(int *)*in = (int)(*in)[0] + iVar32 >> auVar33;
  *(int *)((long)*in + 4) = iVar1 + iVar32 >> auVar33;
  *(int *)(*in + 1) = (int)lVar17 + iVar32 >> auVar33;
  *(int *)((long)*in + 0xc) = iVar2 + iVar32 >> auVar33;
  *(int *)in[1] = (int)lVar18 + iVar32 >> auVar33;
  *(int *)((long)in[1] + 4) = iVar3 + iVar32 >> auVar33;
  *(int *)(in[1] + 1) = (int)lVar19 + iVar32 >> auVar33;
  *(int *)((long)in[1] + 0xc) = iVar4 + iVar32 >> auVar33;
  *(int *)in[2] = (int)lVar20 + iVar32 >> auVar33;
  *(int *)((long)in[2] + 4) = iVar5 + iVar32 >> auVar33;
  *(int *)(in[2] + 1) = (int)lVar21 + iVar32 >> auVar33;
  *(int *)((long)in[2] + 0xc) = iVar6 + iVar32 >> auVar33;
  *(int *)in[3] = (int)lVar22 + iVar32 >> auVar33;
  *(int *)((long)in[3] + 4) = iVar7 + iVar32 >> auVar33;
  *(int *)(in[3] + 1) = (int)lVar23 + iVar32 >> auVar33;
  *(int *)((long)in[3] + 0xc) = iVar8 + iVar32 >> auVar33;
  *(int *)in[4] = (int)lVar24 + iVar32 >> auVar33;
  *(int *)((long)in[4] + 4) = iVar9 + iVar32 >> auVar33;
  *(int *)(in[4] + 1) = (int)lVar25 + iVar32 >> auVar33;
  *(int *)((long)in[4] + 0xc) = iVar10 + iVar32 >> auVar33;
  *(int *)in[5] = (int)lVar26 + iVar32 >> auVar33;
  *(int *)((long)in[5] + 4) = iVar11 + iVar32 >> auVar33;
  *(int *)(in[5] + 1) = (int)lVar27 + iVar32 >> auVar33;
  *(int *)((long)in[5] + 0xc) = iVar12 + iVar32 >> auVar33;
  *(int *)in[6] = (int)lVar28 + iVar32 >> auVar33;
  *(int *)((long)in[6] + 4) = iVar13 + iVar32 >> auVar33;
  *(int *)(in[6] + 1) = (int)lVar29 + iVar32 >> auVar33;
  *(int *)((long)in[6] + 0xc) = iVar14 + iVar32 >> auVar33;
  *(int *)in[7] = iVar32 + (int)lVar30 >> auVar33;
  *(int *)((long)in[7] + 4) = iVar32 + iVar15 >> auVar33;
  *(int *)(in[7] + 1) = iVar32 + (int)lVar31 >> auVar33;
  *(int *)((long)in[7] + 0xc) = iVar32 + iVar16 >> auVar33;
  return;
}

Assistant:

static inline void col_txfm_4x8_rounding(__m128i *in, int shift) {
  const __m128i rounding = _mm_set1_epi32(1 << (shift - 1));

  in[0] = _mm_add_epi32(in[0], rounding);
  in[1] = _mm_add_epi32(in[1], rounding);
  in[2] = _mm_add_epi32(in[2], rounding);
  in[3] = _mm_add_epi32(in[3], rounding);
  in[4] = _mm_add_epi32(in[4], rounding);
  in[5] = _mm_add_epi32(in[5], rounding);
  in[6] = _mm_add_epi32(in[6], rounding);
  in[7] = _mm_add_epi32(in[7], rounding);

  in[0] = _mm_srai_epi32(in[0], shift);
  in[1] = _mm_srai_epi32(in[1], shift);
  in[2] = _mm_srai_epi32(in[2], shift);
  in[3] = _mm_srai_epi32(in[3], shift);
  in[4] = _mm_srai_epi32(in[4], shift);
  in[5] = _mm_srai_epi32(in[5], shift);
  in[6] = _mm_srai_epi32(in[6], shift);
  in[7] = _mm_srai_epi32(in[7], shift);
}